

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O3

void mwrite(memfile *mf,void *buf,uint num)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  mdiff_cmd mVar4;
  char *pcVar5;
  uint uVar6;
  mdiff_cmd mVar7;
  mdiff_cmd mVar8;
  
  uVar2 = mf->len;
  iVar3 = mf->pos;
  uVar1 = iVar3 + num;
  if (uVar2 < uVar1) {
    uVar6 = uVar2 + 0x1000;
    if (uVar2 + 0x1000 < uVar1) {
      uVar6 = uVar1;
    }
    iVar3 = uVar2 + (~uVar2 + uVar6 & 0xfffff000) + 0x1000;
    mf->len = iVar3;
    pcVar5 = (char *)realloc(mf->buf,(long)iVar3);
    mf->buf = pcVar5;
    iVar3 = mf->pos;
  }
  else {
    pcVar5 = mf->buf;
  }
  memcpy(pcVar5 + iVar3,buf,(ulong)num);
  if (mf->relativeto == (memfile *)0x0) {
    mf->pos = mf->pos + num;
  }
  else if (num != 0) {
    iVar3 = mf->relativepos;
    do {
      if (iVar3 < mf->relativeto->pos) {
        mVar4 = mf->curcmd;
        if (mf->buf[mf->pos] != mf->relativeto->buf[iVar3]) goto LAB_001c4501;
        mVar8 = MDIFF_COPY;
        mVar7 = MDIFF_COPY;
        if (mVar4 == MDIFF_COPY) {
          iVar3 = mf->curcount;
          goto joined_r0x001c4514;
        }
LAB_001c4516:
        mVar7 = mVar8;
        mdiffflush(mf);
        iVar3 = 0;
      }
      else {
        mVar4 = mf->curcmd;
LAB_001c4501:
        mVar8 = MDIFF_EDIT;
        mVar7 = MDIFF_EDIT;
        if (mVar4 != MDIFF_EDIT) goto LAB_001c4516;
        iVar3 = mf->curcount;
joined_r0x001c4514:
        if (0x3ffe < iVar3) goto LAB_001c4516;
      }
      num = num - 1;
      mf->curcmd = mVar7;
      mf->curcount = iVar3 + 1;
      mf->pos = mf->pos + 1;
      iVar3 = mf->relativepos + 1;
      mf->relativepos = iVar3;
    } while (num != 0);
  }
  return;
}

Assistant:

void mwrite(struct memfile *mf, const void *buf, unsigned int num)
{
	boolean do_realloc = FALSE;
	while (mf->len < mf->pos + num) {
	    mf->len += 4096;
	    do_realloc = TRUE;
	}

	if (do_realloc)
	    mf->buf = realloc(mf->buf, mf->len);
	memcpy(&mf->buf[mf->pos], buf, num);

	if (!mf->relativeto) {
	    mf->pos += num;
	} else {
	    /* calculate and record the diff as well */
	    while (num--) {
		if (mf->relativepos < mf->relativeto->pos &&
		    mf->buf[mf->pos] == mf->relativeto->buf[mf->relativepos]) {
		    if (mf->curcmd != MDIFF_COPY || mf->curcount >= 0x3fff) {
			mdiffflush(mf);
			mf->curcount = 0;
		    }
		    mf->curcmd = MDIFF_COPY;
		    mf->curcount++;
		} else {
		    /*
		     * Note that mdiffflush is responsible for writing the
		     * actual data that was edited, once we have a complete
		     * run of it. So there's no need to record the data
		     * anywhere but in buf.
		     */
		    if (mf->curcmd != MDIFF_EDIT || mf->curcount >= 0x3fff) {
			mdiffflush(mf);
			mf->curcount = 0;
		    }
		    mf->curcmd = MDIFF_EDIT;
		    mf->curcount++;
		}
		mf->pos++;
		mf->relativepos++;
	    }
	}
}